

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

TaggedStringPtr __thiscall
google::protobuf::internal::anon_unknown_7::CreateArenaString
          (anon_unknown_7 *this,Arena *arena,string_view s)

{
  Arena *pAVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  TaggedStringPtr TVar3;
  string *psVar4;
  anon_unknown_7 *this_00;
  ulong extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBX;
  TaggedStringPtr TVar5;
  _GLOBAL__N_1 *this_01;
  anon_class_8_1_a7a63227 *paVar6;
  ulong uVar7;
  ArenaStringPtr *pAVar8;
  string_view s_00;
  ArenaStringPtr aAStack_70 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_60;
  anon_class_8_1_a7a63227 local_30 [2];
  Arena *local_20;
  char *local_18;
  anon_class_8_1_a7a63227 local_10;
  
  local_18 = (char *)s._M_len;
  this_00 = (anon_unknown_7 *)&local_20;
  local_30[0].arena = (Arena *)this;
  local_20 = arena;
  local_10.arena = (Arena *)this;
  pbVar2 = absl::lts_20240722::utility_internal::
           IfConstexprElse<false,google::protobuf::Arena::Create<std::__cxx11::string,char_const*,unsigned_long>(google::protobuf::Arena*,char_const*&&,unsigned_long&&)::_lambda((auto:1&&)___)_1_,google::protobuf::Arena::Create<std::__cxx11::string,char_const*,unsigned_long>(google::protobuf::Arena*,char_const*&&,unsigned_long&&)::_lambda((auto:1&&)___)_2_,char_const*,unsigned_long>
                     (local_30,&local_10,&local_18,(unsigned_long *)this_00);
  if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    this_01 = (_GLOBAL__N_1 *)local_30;
    _GLOBAL__N_1::CreateArenaString(this_01);
LAB_0013507f:
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((ulong)this_01,0,"reinterpret_cast<uintptr_t>(p) & kMask == 0UL");
  }
  else {
    this_01 = (_GLOBAL__N_1 *)((ulong)pbVar2 & 3);
    unaff_RBX = pbVar2;
    if (this_01 != (_GLOBAL__N_1 *)0x0) goto LAB_0013507f;
    psVar4 = (string *)0x0;
  }
  if (psVar4 == (string *)0x0) {
    return (TaggedStringPtr)(void *)((ulong)unaff_RBX | 3);
  }
  paVar6 = local_30;
  _GLOBAL__N_1::CreateArenaString();
  pAVar8 = aAStack_70;
  pAVar1 = paVar6->arena;
  pbStack_60 = unaff_RBX;
  if (((ulong)pAVar1 & 3) == 0) {
    if (this_00 != (anon_unknown_7 *)0x0) {
      s_00._M_str = (char *)this_00;
      s_00._M_len = extraout_RDX;
      TVar3 = CreateArenaString(this_00,(Arena *)psVar4,s_00);
      TVar5 = TVar3;
      goto LAB_00135141;
    }
    unaff_RBX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                operator_new(0x20);
    (unaff_RBX->_M_dataplus)._M_p = (pointer)&unaff_RBX->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)unaff_RBX,extraout_RDX,(Arena *)psVar4 + extraout_RDX);
    pAVar8 = (ArenaStringPtr *)((ulong)unaff_RBX & 3);
    if (pAVar8 != (ArenaStringPtr *)0x0) goto LAB_00135162;
    psVar4 = (string *)0x0;
  }
  else {
    if (((ulong)pAVar1 & 2) == 0) {
      ArenaStringPtr::Set(aAStack_70);
    }
    else {
      uVar7 = (ulong)pAVar1 & 0xfffffffffffffffc;
      if (uVar7 != 0) {
        TVar3.ptr_ = (void *)std::__cxx11::string::_M_replace
                                       (uVar7,0,*(char **)(uVar7 + 8),extraout_RDX);
        return (TaggedStringPtr)TVar3.ptr_;
      }
    }
    ArenaStringPtr::Set(aAStack_70);
LAB_00135162:
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((ulong)pAVar8,0,"reinterpret_cast<uintptr_t>(p) & kMask == 0UL");
  }
  if (psVar4 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aAStack_70,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/arenastring.h"
               ,0xbe,*(undefined8 *)(psVar4 + 8),*(undefined8 *)psVar4);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)aAStack_70);
  }
  TVar3.ptr_ = (void *)0x0;
  TVar5.ptr_ = (Arena *)((ulong)unaff_RBX | 2);
LAB_00135141:
  paVar6->arena = (Arena *)TVar5.ptr_;
  return (TaggedStringPtr)TVar3.ptr_;
}

Assistant:

TaggedStringPtr CreateArenaString(Arena& arena, absl::string_view s) {
  TaggedStringPtr res;
  res.SetMutableArena(Arena::Create<std::string>(&arena, s.data(), s.length()));
  return res;
}